

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wxcli.hpp
# Opt level: O1

string * __thiscall
ws::msg_type_to_str_abi_cxx11_(string *__return_storage_ptr__,ws *this,MsgType type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  default:
    pcVar2 = "none";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "text";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "file";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "markdown";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "image";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string msg_type_to_str(MsgType type)
  {
    switch (type)
    {
      case MsgType::none:
        return "none";
      case MsgType::text:
        return "text";
      case MsgType::file:
        return "file";
      case MsgType::markdown:
        return "markdown";
      case MsgType::image:
        return "image";
    }
    return "none";
  }